

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O3

void __thiscall
dg::dda::MemorySSATransformation::collectAllDefinitions
          (MemorySSATransformation *this,Definitions *defs,RWBBlock *from,
          set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
          *visitedBlocks,bool escaping)

{
  RWBBlock *from_00;
  Definitions *from_01;
  pointer ppRVar1;
  __node_base _Var2;
  pair<std::_Rb_tree_iterator<dg::dda::RWBBlock_*>,_bool> pVar3;
  __alloc_node_gen_t __alloc_node_gen;
  DefinitionsMap<dg::dda::RWNode> olddefinitions;
  RWBBlock *local_120;
  set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
  *local_118;
  vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *local_110;
  pointer local_108;
  MemorySSATransformation *local_100;
  Definitions local_f8;
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_120 = from;
  local_118 = visitedBlocks;
  pVar3 = std::
          _Rb_tree<dg::dda::RWBBlock*,dg::dda::RWBBlock*,std::_Identity<dg::dda::RWBBlock*>,std::less<dg::dda::RWBBlock*>,std::allocator<dg::dda::RWBBlock*>>
          ::_M_insert_unique<dg::dda::RWBBlock*const&>
                    ((_Rb_tree<dg::dda::RWBBlock*,dg::dda::RWBBlock*,std::_Identity<dg::dda::RWBBlock*>,std::less<dg::dda::RWBBlock*>,std::allocator<dg::dda::RWBBlock*>>
                      *)visitedBlocks,&local_120);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    from_01 = getBBlockDefinitions(this,local_120,(DefSite *)0x0);
    joinDefinitions(from_01,defs,escaping);
    ppRVar1 = *(pointer *)
               ((long)&(local_120->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                       super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                       _predecessors.
                       super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>
                       ._M_impl.super__Vector_impl_data + 8);
    if (((long)ppRVar1 -
         (long)(local_120->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
               super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
               _predecessors.
               super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl
               .super__Vector_impl_data._M_start == 8) &&
       (from_00 = ppRVar1[-1], from_00 != (RWBBlock *)0x0)) {
      collectAllDefinitions(this,defs,from_00,local_118,escaping);
    }
    else {
      local_f8._0_8_ = &local_68;
      local_68._M_buckets = (__buckets_ptr)0x0;
      local_68._M_bucket_count = (defs->definitions)._definitions._M_h._M_bucket_count;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = (defs->definitions)._definitions._M_h._M_element_count;
      local_68._M_rehash_policy._M_max_load_factor =
           (defs->definitions)._definitions._M_h._M_rehash_policy._M_max_load_factor;
      local_68._M_rehash_policy._4_4_ =
           *(undefined4 *)&(defs->definitions)._definitions._M_h._M_rehash_policy.field_0x4;
      local_68._M_rehash_policy._M_next_resize =
           (defs->definitions)._definitions._M_h._M_rehash_policy._M_next_resize;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      local_100 = this;
      std::
      _Hashtable<dg::dda::RWNode*,std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>,std::allocator<std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>>,std::__detail::_Select1st,std::equal_to<dg::dda::RWNode*>,std::hash<dg::dda::RWNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<dg::dda::RWNode*,std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>,std::allocator<std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>>,std::__detail::_Select1st,std::equal_to<dg::dda::RWNode*>,std::hash<dg::dda::RWNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>,false>>>>
                ((_Hashtable<dg::dda::RWNode*,std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>,std::allocator<std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>>,std::__detail::_Select1st,std::equal_to<dg::dda::RWNode*>,std::hash<dg::dda::RWNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_f8._0_8_,
                 (_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)&defs->definitions,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>_>_>
                  *)&local_f8);
      ppRVar1 = (local_120->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                _predecessors.
                super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_108 = *(pointer *)
                   ((long)&(local_120->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                           super_CFGElement<dg::dda::RWBBlock>.
                           super_ElemWithEdges<dg::dda::RWBBlock>._predecessors.
                           super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>
                           ._M_impl.super__Vector_impl_data + 8);
      if (ppRVar1 != local_108) {
        local_110 = (vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)
                    &defs->unknownWrites;
        do {
          local_f8._0_8_ = local_f8._0_8_ & 0xffffffffffffff00;
          local_f8.definitions._definitions._M_h._M_buckets =
               &local_f8.definitions._definitions._M_h._M_single_bucket;
          local_f8.definitions._definitions._M_h._M_bucket_count = 1;
          local_f8.definitions._definitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_f8.definitions._definitions._M_h._M_element_count = 0;
          local_f8.definitions._definitions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          local_f8.definitions._definitions._M_h._M_rehash_policy._4_4_ = 0;
          local_f8.definitions._definitions._M_h._M_rehash_policy._M_next_resize = 0;
          local_f8.definitions._definitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
          local_f8.kills._definitions._M_h._M_buckets =
               &local_f8.kills._definitions._M_h._M_single_bucket;
          local_f8.kills._definitions._M_h._M_bucket_count = 1;
          local_f8.kills._definitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_f8.kills._definitions._M_h._M_element_count = 0;
          local_f8.kills._definitions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          local_f8.kills._definitions._M_h._M_rehash_policy._4_4_ = 0;
          local_f8.unknownWrites.
          super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_f8.unknownWrites.
          super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_f8.unknownWrites.
          super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_f8.kills._definitions._M_h._M_rehash_policy._M_next_resize = 0;
          local_f8.kills._definitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
          std::
          _Hashtable<dg::dda::RWNode*,std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>,std::allocator<std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>>,std::__detail::_Select1st,std::equal_to<dg::dda::RWNode*>,std::hash<dg::dda::RWNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_assign_elements<std::_Hashtable<dg::dda::RWNode*,std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>,std::allocator<std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>>,std::__detail::_Select1st,std::equal_to<dg::dda::RWNode*>,std::hash<dg::dda::RWNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                    ((_Hashtable<dg::dda::RWNode*,std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>,std::allocator<std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>>,std::__detail::_Select1st,std::equal_to<dg::dda::RWNode*>,std::hash<dg::dda::RWNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&local_f8.definitions,&local_68);
          collectAllDefinitions(local_100,&local_f8,*ppRVar1,local_118,escaping);
          for (_Var2._M_nxt = local_f8.definitions._definitions._M_h._M_before_begin._M_nxt;
              _Var2._M_nxt != (_Hash_node_base *)0x0; _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt) {
            DefinitionsMap<dg::dda::RWNode>::add
                      (&defs->definitions,(RWNode *)_Var2._M_nxt[1]._M_nxt,
                       (OffsetsT *)(_Var2._M_nxt + 2));
          }
          std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode**,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>>
                    (local_110,
                     (defs->unknownWrites).
                     super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     local_f8.unknownWrites.
                     super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_f8.unknownWrites.
                     super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          if (local_f8.unknownWrites.
              super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f8.unknownWrites.
                            super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_f8.unknownWrites.
                                  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f8.unknownWrites.
                                  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&local_f8.kills);
          std::
          _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&local_f8.definitions);
          ppRVar1 = ppRVar1 + 1;
        } while (ppRVar1 != local_108);
      }
      std::
      _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
    }
  }
  return;
}

Assistant:

void MemorySSATransformation::collectAllDefinitions(
        Definitions &defs, RWBBlock *from, std::set<RWBBlock *> &visitedBlocks,
        bool escaping) {
    assert(from);

    if (!visitedBlocks.insert(from).second) {
        return; // we already visited this block
    }

    // get the definitions from this block
    joinDefinitions(getBBlockDefinitions(from), defs, escaping);

    // recur into predecessors
    if (auto *singlePred = from->getSinglePredecessor()) {
        collectAllDefinitions(defs, singlePred, visitedBlocks, escaping);
    } else {
        auto olddefinitions = defs.definitions;
        for (auto I = from->pred_begin(), E = from->pred_end(); I != E; ++I) {
            Definitions tmpDefs;
            tmpDefs.definitions = olddefinitions;
            collectAllDefinitions(tmpDefs, *I, visitedBlocks, escaping);
            defs.definitions.add(tmpDefs.definitions);
            defs.unknownWrites.insert(defs.unknownWrites.end(),
                                      tmpDefs.unknownWrites.begin(),
                                      tmpDefs.unknownWrites.end());
        }
    }
}